

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  RegularExpression *this_00;
  RegularExpression *this_01;
  bool bVar1;
  cmListFileContext *pcVar2;
  long line_00;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  pointer filename;
  string indentation;
  string line;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = (input->_M_dataplus)._M_p;
  this_00 = &this->cmDefineRegex;
  this_01 = &this->cmDefine01Regex;
  pcVar5 = pcVar3;
  do {
    pcVar4 = pcVar5;
    if (pcVar5 == pcVar3 + input->_M_string_length) {
      bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                        (&(this->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      if (bVar1) {
        line_00 = -1;
        filename = (char *)0x0;
      }
      else {
        pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                           (&(this->Backtrace).
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
        filename = (pcVar2->FilePath)._M_dataplus._M_p;
        line_00 = pcVar2->Line;
      }
      ExpandVariablesInString(this,output,escapeQuotes,true,atOnly,filename,line_00,true,true);
      return;
    }
    for (; (pcVar4 != pcVar3 + input->_M_string_length && (*pcVar4 != '\n')); pcVar4 = pcVar4 + 1) {
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&line,pcVar5,pcVar4);
    pcVar3 = (input->_M_dataplus)._M_p + input->_M_string_length;
    bVar1 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
    if (bVar1) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&indentation,&this_00->regmatch,2);
      GetDefinition(this,&indentation);
      std::__cxx11::string::~string((string *)&indentation);
      bVar1 = cmIsOff((cmValue)0x18e65b);
      if (bVar1) {
        std::__cxx11::string::append((char *)output);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&indentation,&this_00->regmatch,2);
        std::__cxx11::string::append((string *)output);
        std::__cxx11::string::~string((string *)&indentation);
        std::__cxx11::string::append((char *)output);
      }
      else {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&indentation,&this_00->regmatch,1);
        std::operator+(&local_70,"#",&indentation);
        std::operator+(&local_b0,&local_70,"cmakedefine");
        std::operator+(&local_90,"#",&indentation);
        std::operator+(&local_50,&local_90,"define");
        cmsys::SystemTools::ReplaceString(&line,&local_b0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((string *)output);
LAB_0018e8d2:
        std::__cxx11::string::~string((string *)&indentation);
      }
    }
    else {
      bVar1 = cmsys::RegularExpression::find(this_01,line._M_dataplus._M_p);
      if (bVar1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&indentation,&this_01->regmatch,1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_b0,&this_01->regmatch,2);
        GetDefinition(this,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::operator+(&local_70,"#",&indentation);
        std::operator+(&local_b0,&local_70,"cmakedefine01");
        std::operator+(&local_90,"#",&indentation);
        std::operator+(&local_50,&local_90,"define");
        cmsys::SystemTools::ReplaceString(&line,&local_b0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((string *)output);
        cmIsOff((cmValue)0x18e7d4);
        std::__cxx11::string::append((char *)output);
        goto LAB_0018e8d2;
      }
      std::__cxx11::string::append((string *)output);
    }
    if (pcVar4 != pcVar3) {
      std::__cxx11::string::append((char *)output);
    }
    pcVar5 = pcVar4 + (pcVar4 != pcVar3);
    std::__cxx11::string::~string((string *)&line);
    pcVar3 = (input->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input, std::string& output,
                                 bool atOnly, bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while (lineStart != input.end()) {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while (lineEnd != input.end() && *lineEnd != '\n') {
      ++lineEnd;
    }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if (haveNewline) {
      ++lineEnd;
    }

    // Replace #cmakedefine instances.
    if (this->cmDefineRegex.find(line)) {
      cmValue def = this->GetDefinition(this->cmDefineRegex.match(2));
      if (!cmIsOff(def)) {
        const std::string indentation = this->cmDefineRegex.match(1);
        cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine",
                                     "#" + indentation + "define");
        output += line;
      } else {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(2);
        output += " */";
      }
    } else if (this->cmDefine01Regex.find(line)) {
      const std::string indentation = this->cmDefine01Regex.match(1);
      cmValue def = this->GetDefinition(this->cmDefine01Regex.match(2));
      cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine01",
                                   "#" + indentation + "define");
      output += line;
      if (!cmIsOff(def)) {
        output += " 1";
      } else {
        output += " 0";
      }
    } else {
      output += line;
    }

    if (haveNewline) {
      output += "\n";
    }

    // Move to the next line.
    lineStart = lineEnd;
  }

  // Perform variable replacements.
  const char* filename = nullptr;
  long lineNumber = -1;
  if (!this->Backtrace.Empty()) {
    const auto& currentTrace = this->Backtrace.Top();
    filename = currentTrace.FilePath.c_str();
    lineNumber = currentTrace.Line;
  }
  this->ExpandVariablesInString(output, escapeQuotes, true, atOnly, filename,
                                lineNumber, true, true);
}